

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::throw_exception<hta::Exception,char_const*,std::__cxx11::string>
               (char *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1
               )

{
  Exception *this;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a1;
  stringstream local_1a0 [8];
  stringstream msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char *args_local;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::string::string((string *)&local_1c8,(string *)args_1);
  detail::
  make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator()(&local_1a1,(stringstream *)local_1a0,args,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_1f8);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}